

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

string * __thiscall
kratos::VarCasted::to_string_abi_cxx11_(string *__return_storage_ptr__,VarCasted *this)

{
  remove_reference_t<std::__cxx11::basic_string<char>_> *this_00;
  remove_reference_t<std::__cxx11::basic_string<char>_> *args;
  string *format_str;
  char (*format_str_00) [13];
  char (*format_str_01) [15];
  char (*format_str_02) [63];
  remove_reference_t<std::__cxx11::basic_string<char>_> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str_03;
  string_view format_str_04;
  string_view format_str_05;
  string_view format_str_06;
  string_view format_str_07;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_388;
  remove_reference_t<const_std::__cxx11::basic_string<char>_&> local_368;
  string *local_348;
  string *enum_name;
  v7 local_338 [32];
  string local_318;
  v7 local_2f8 [48];
  v7 local_2c8 [32];
  VarCasted *local_2a8;
  VarCasted *this_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_298;
  basic_string_view<char> local_288;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_278;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_268;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_258;
  string *local_250;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_248;
  basic_string_view<char> local_238;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_228;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_218;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  char *local_208;
  string *local_200;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_1f8;
  basic_string_view<char> local_1e8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_1d8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_1c8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_2;
  char *local_1b8;
  string *local_1b0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_1a8;
  basic_string_view<char> local_198;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_160;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_3;
  string *local_150;
  char *local_148;
  string *local_140;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_138;
  basic_string_view<char> local_128;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_f8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_4;
  uint32_t *local_e8;
  char *local_e0;
  string *local_d8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_d0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_c8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_c0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_b8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_b0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_a8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_a0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_98;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_90;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_88;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_80;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_70;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  local_2a8 = this;
  this_local = (VarCasted *)__return_storage_ptr__;
  if (this->cast_type_ == Signed) {
    (*(this->parent_var_->super_IRNode)._vptr_IRNode[0x1f])();
    local_258 = "signed\'({0})";
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_2c8;
    local_250 = __return_storage_ptr__;
    local_278.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<std::__cxx11::string,char[13],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x42a32b,local_2c8,format_str_00,
                    (remove_reference_t<std::__cxx11::basic_string<char>_> *)0x42a32b);
    local_268 = &local_278;
    local_288 = fmt::v7::to_string_view<char,_0>(local_258);
    local_a8 = &local_298;
    local_b0 = local_268;
    local_a0 = local_268;
    local_60 = local_268;
    local_98 = local_a8;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_a8,0xd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_268->string);
    format_str_03.size_ = local_298.desc_;
    format_str_03.data_ = (char *)local_288.size_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_298.field_1.values_;
    fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)local_288.data_,format_str_03,args_00);
    std::__cxx11::string::~string((string *)local_2c8);
  }
  else if (this->cast_type_ == Unsigned) {
    (*(this->parent_var_->super_IRNode)._vptr_IRNode[0x1f])();
    local_208 = "unsigned\'({0})";
    vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_2f8;
    local_200 = __return_storage_ptr__;
    local_228.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<std::__cxx11::string,char[15],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)"unsigned\'({0})",local_2f8,format_str_01,
                    (remove_reference_t<std::__cxx11::basic_string<char>_> *)"unsigned\'({0})");
    local_218 = &local_228;
    local_238 = fmt::v7::to_string_view<char,_0>(local_208);
    local_b8 = &local_248;
    local_c0 = local_218;
    local_90 = local_218;
    local_68 = local_218;
    local_88 = local_b8;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_b8,0xd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_218->string);
    format_str_04.size_ = local_248.desc_;
    format_str_04.data_ = (char *)local_238.size_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_248.field_1.values_;
    fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)local_238.data_,format_str_04,args_01);
    std::__cxx11::string::~string((string *)local_2f8);
  }
  else if (this->cast_type_ == Enum) {
    if (this->enum_type_ == (Enum *)0x0) {
      enum_name._7_1_ = 1;
      this_00 = (remove_reference_t<std::__cxx11::basic_string<char>_> *)
                __cxa_allocate_exception(0x10);
      args = this_00;
      (*(this->parent_var_->super_IRNode)._vptr_IRNode[0x1f])(local_338);
      local_1b0 = &local_318;
      local_1b8 = "Variable {0} is casted as a enum without enum type information";
      vargs_2 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_338;
      local_1d8.named_args.data =
           (named_arg_info<char> *)
           fmt::v7::make_args_checked<std::__cxx11::string,char[63],char>
                     ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)"Variable {0} is casted as a enum without enum type information",
                      (v7 *)vargs_2,format_str_02,args);
      local_1c8 = &local_1d8;
      local_1e8 = fmt::v7::to_string_view<char,_0>(local_1b8);
      local_c8 = &local_1f8;
      local_d0 = local_1c8;
      local_80 = local_1c8;
      local_70 = local_1c8;
      local_78 = local_c8;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_c8,0xd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)&local_1c8->string);
      format_str_05.size_ = local_1f8.desc_;
      format_str_05.data_ = (char *)local_1e8.size_;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_1f8.field_1.values_;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_318,(detail *)local_1e8.data_,format_str_05,args_02);
      UserException::UserException((UserException *)this_00,&local_318);
      enum_name._7_1_ = 0;
      __cxa_throw(this_00,&UserException::typeinfo,UserException::~UserException);
    }
    format_str = &this->enum_type_->name;
    local_348 = format_str;
    (*(this->parent_var_->super_IRNode)._vptr_IRNode[0x1f])();
    local_148 = "{0}\'({1})";
    vargs_3 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_368;
    local_150 = format_str;
    local_140 = __return_storage_ptr__;
    fmt::v7::make_args_checked<std::__cxx11::string_const&,std::__cxx11::string,char[10],char>
              (&local_188,(v7 *)"{0}\'({1})",(char (*) [10])format_str,&local_368,in_R8);
    local_160 = &local_188;
    local_198 = fmt::v7::to_string_view<char,_0>(local_148);
    local_50 = &local_1a8;
    local_58 = local_160;
    local_48 = local_160;
    local_38 = local_160;
    local_40 = local_50;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_50,0xdd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_160);
    format_str_06.size_ = local_1a8.desc_;
    format_str_06.data_ = (char *)local_198.size_;
    args_03.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_03.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_1a8.field_1.values_;
    fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)local_198.data_,format_str_06,args_03);
    std::__cxx11::string::~string((string *)&local_368);
  }
  else if (this->cast_type_ == Resize) {
    (*(this->parent_var_->super_IRNode)._vptr_IRNode[0x1f])();
    local_e0 = "{0}\'({1})";
    vargs_4 = &local_388;
    local_e8 = &this->target_width_;
    local_d8 = __return_storage_ptr__;
    fmt::v7::make_args_checked<unsigned_int_const&,std::__cxx11::string,char[10],char>
              (&local_118,(v7 *)"{0}\'({1})",(char (*) [10])&this->target_width_,
               (remove_reference_t<const_unsigned_int_&> *)&local_388,in_R8);
    local_f8 = &local_118;
    local_128 = fmt::v7::to_string_view<char,_0>(local_e0);
    local_28 = &local_138;
    local_30 = local_f8;
    local_20 = local_f8;
    local_10 = local_f8;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0xd2,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_f8);
    format_str_07.size_ = local_138.desc_;
    format_str_07.data_ = (char *)local_128.size_;
    args_04.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_04.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_138.field_1.values_;
    fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)local_128.data_,format_str_07,args_04);
    std::__cxx11::string::~string((string *)&local_388);
  }
  else {
    (*(this->parent_var_->super_IRNode)._vptr_IRNode[0x1f])(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VarCasted::to_string() const {
    if (cast_type_ == VarCastType::Signed) {
        return ::format("signed'({0})", parent_var_->to_string());
    } else if (cast_type_ == VarCastType::Unsigned) {
        return ::format("unsigned'({0})", parent_var_->to_string());
    } else if (cast_type_ == VarCastType::Enum) {
        if (!enum_type_) {
            throw UserException(
                ::format("Variable {0} is casted as a enum without "
                         "enum type information",
                         parent_var_->to_string()));
        }
        auto const &enum_name = enum_type_->name;
        return ::format("{0}'({1})", enum_name, parent_var_->to_string());
    } else if (cast_type_ == VarCastType::Resize) {
        return ::format("{0}'({1})", target_width_, parent_var_->to_string());
    } else {
        return parent_var_->to_string();
    }
}